

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_read_legacy_binary(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  undefined **ppuVar5;
  uint32_t len;
  bson_subtype_t subtype;
  uint8_t *binary;
  bson_t b;
  bson_error_t error;
  undefined8 uVar6;
  uint local_390;
  uint local_38c;
  char *local_388;
  undefined1 local_380 [200];
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [640];
  
  ppuVar5 = &PTR_anon_var_dwarf_156cb_0014f240;
  while( true ) {
    if (*ppuVar5 == (undefined *)0x0) {
      return;
    }
    cVar1 = bson_init_from_json(local_380,*ppuVar5,0xffffffffffffffff,local_2b8);
    if (cVar1 == '\0') {
      fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x4e6,"test_bson_json_read_legacy_binary","r",local_2b0);
      fflush(_stderr);
      abort();
    }
    uVar3 = bson_bcone_magic();
    bcon_extract(local_380,"x",uVar3,4,&local_38c,&local_388,&local_390,0);
    pcVar4 = local_388;
    if (local_38c != 5) break;
    if (local_390 != 3) {
      pcVar4 = "FAIL\n\nAssert Failure: %u %s %u\n%s:%d  %s()\n";
      uVar3 = 3;
      uVar6 = 0x4e9;
      goto LAB_001230dd;
    }
    if (local_388 != "foo") {
      iVar2 = strcmp(local_388,"foo");
      if (iVar2 != 0) {
        fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",pcVar4,"foo");
        abort();
      }
    }
    bson_destroy(local_380);
    ppuVar5 = ppuVar5 + 1;
  }
  pcVar4 = "FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n";
  uVar3 = 5;
  uVar6 = 0x4e8;
  local_390 = local_38c;
LAB_001230dd:
  fprintf(_stderr,pcVar4,(ulong)local_390,"==",uVar3,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar6,"test_bson_json_read_legacy_binary");
  abort();
}

Assistant:

static void
test_bson_json_read_legacy_binary (void)
{
   const char *jsons[] = {"{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}",
                          "{\"x\": {\"$type\": \"05\", \"$binary\": \"Zm9v\"}}",
                          NULL};

   const char **json;
   bson_error_t error;
   bson_t b;
   bool r;
   bson_subtype_t subtype;
   uint32_t len;
   const uint8_t *binary;

   for (json = jsons; *json; json++) {
      r = bson_init_from_json (&b, *json, -1, &error);

      ASSERT_OR_PRINT (r, error);
      BCON_EXTRACT (&b, "x", BCONE_BIN (subtype, binary, len));
      ASSERT_CMPINT ((int) subtype, ==, 5);
      ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
      ASSERT_CMPSTR ((const char *) binary, "foo");

      bson_destroy (&b);
   }
}